

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall MarrayTest::copyConstructorTest<true>(MarrayTest *this)

{
  undefined1 *puVar1;
  allocator<unsigned_long> *paVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  reference piVar6;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  reference piVar10;
  iterator iVar11;
  bool local_11f1;
  bool local_1181;
  bool local_1111;
  bool local_10c9;
  bool local_1041;
  bool local_fa9;
  bool local_f61;
  bool local_ef1;
  bool local_e71;
  bool local_e19;
  bool local_dd9;
  bool local_d89;
  bool local_d39;
  bool local_cd1;
  int local_cd0;
  int local_ccc;
  int x_10;
  int y_7;
  int z_3;
  Marray<int,_std::allocator<unsigned_long>_> m_14;
  undefined1 local_c58 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_c10 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_5;
  undefined1 local_bf0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  int local_bd0;
  int local_bcc;
  int x_9;
  int y_6;
  int z_2;
  Marray<int,_std::allocator<unsigned_long>_> m_13;
  undefined1 local_b58 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_b10 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_4;
  undefined1 local_af0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  int local_ad0;
  int local_acc;
  int z_1;
  int y_5;
  int x_8;
  Marray<int,_std::allocator<unsigned_long>_> m_12;
  undefined1 local_a60 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_a18 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  int local_9f8;
  int local_9f4;
  int x_7;
  int y_4;
  Marray<int,_std::allocator<unsigned_long>_> m_11;
  undefined1 local_988 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_940 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_3;
  undefined1 local_920 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  int local_900;
  int local_8fc;
  int x_6;
  int y_3;
  Marray<int,_std::allocator<unsigned_long>_> m_10;
  undefined1 local_890 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_848 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_2;
  undefined1 local_828 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  int local_808;
  int y_2;
  int x_5;
  Marray<int,_std::allocator<unsigned_long>_> m_9;
  undefined1 local_7a0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_758 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  int local_738;
  int local_734;
  int x_4;
  int i_2;
  Marray<int,_std::allocator<unsigned_long>_> m_8;
  undefined1 local_6c8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_680 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_1;
  undefined1 local_660 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  int local_640;
  int local_63c;
  int x_3;
  int i_1;
  Marray<int,_std::allocator<unsigned_long>_> m_7;
  undefined1 local_5d0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_588 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides;
  undefined1 local_568 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  int local_548;
  bool local_541;
  int i;
  Marray<int,_std::allocator<unsigned_long>_> m_6;
  undefined1 local_4e0 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_498 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  undefined1 local_478 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_5;
  undefined1 local_428 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  int local_3e0;
  int local_3dc;
  int z;
  int y_1;
  int x_2;
  Marray<int,_std::allocator<unsigned_long>_> n_4;
  undefined1 local_370 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_4;
  undefined1 local_320 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  int local_300;
  int y;
  int x_1;
  Marray<int,_std::allocator<unsigned_long>_> n_3;
  undefined1 local_298 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_3;
  undefined1 local_248 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  int local_228;
  bool local_221;
  int x;
  Marray<int,_std::allocator<unsigned_long>_> n_2;
  undefined1 local_1c0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_2;
  undefined1 local_170 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  undefined1 local_150 [8];
  Marray<int,_std::allocator<unsigned_long>_> n_1;
  undefined1 local_100 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  Marray<int,_std::allocator<unsigned_long>_> n;
  allocator<int> local_59;
  undefined1 local_58 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  MarrayTest *this_local;
  
  m._64_8_ = this;
  std::allocator<int>::allocator(&local_59);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_58,&local_59);
  std::allocator<int>::~allocator(&local_59);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&m_1.field_0x40,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_58);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&m_1.field_0x40);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_58);
  std::allocator<int>::allocator((allocator<int> *)&n_1.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_100,&this->scalar_,
             &andres::defaultOrder,(allocator_type *)&n_1.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_1.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_150,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_100);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_150);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = sVar4 == sVar5;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_100);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_150);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = sVar4 == sVar5;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_100,0);
  iVar3 = *piVar6;
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_150,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = iVar3 == *piVar6;
  test((bool *)((long)&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_150);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_100);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,1,
             (allocator_type *)&m_2.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  std::allocator<int>::allocator((allocator<int> *)&n_2.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_2.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_2.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_1c0);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x);
  local_d39 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x);
    local_d39 = sVar4 == sVar5;
  }
  local_221 = local_d39;
  test(&local_221);
  for (local_228 = 0; local_228 < 0x18; local_228 = local_228 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_1c0,local_228);
    iVar3 = *piVar6;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x,local_228);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_170);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,2,
             (allocator_type *)&m_3.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248);
  std::allocator<int>::allocator((allocator<int> *)&n_3.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_298,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_3.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_3.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_1,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_298);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_298);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
  local_d89 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_298);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_1);
    local_d89 = sVar4 == sVar5;
  }
  y._3_1_ = local_d89;
  test((bool *)((long)&y + 3));
  for (local_300 = 0; local_300 < 6; local_300 = local_300 + 1) {
    for (shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_298,(long)local_300
                          ,shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      iVar3 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_1,(long)local_300,
                          shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_298);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,3,
             (allocator_type *)&m_4.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320);
  std::allocator<int>::allocator((allocator<int> *)&n_4.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_370,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,&this->scalar_,&andres::defaultOrder,
             (allocator_type *)&n_4.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&n_4.field_0x47);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_2,
             (Marray<int,_std::allocator<unsigned_long>_> *)local_370);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_370);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_2);
  local_dd9 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_370);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_2);
    local_dd9 = sVar4 == sVar5;
  }
  y_1._3_1_ = local_dd9;
  test((bool *)((long)&y_1 + 3));
  for (z = 0; z < 3; z = z + 1) {
    for (local_3dc = 0; local_3dc < 4; local_3dc = local_3dc + 1) {
      for (local_3e0 = 0; local_3e0 < 2; local_3e0 = local_3e0 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_370,(long)z,
                            local_3dc,local_3e0);
        iVar3 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&x_2,(long)z,local_3dc,
                            local_3e0);
        v.geometry_._55_1_ = iVar3 == *piVar6;
        test((bool *)&v.geometry_.field_0x37);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_2);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_370);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_320);
  std::allocator<int>::allocator((allocator<int> *)&m_5.field_0x47);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428,&this->scalar_,
             (allocator_type *)&m_5.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_5.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_478,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_478);
  local_e19 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_478);
    local_e19 = false;
    if (sVar4 == sVar5) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_428,0);
      iVar3 = *piVar10;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_478,0);
      local_e19 = iVar3 == *piVar6;
    }
  }
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_e19;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_478);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_428);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498,0);
  *pvVar7 = 0x18;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  std::allocator<int>::allocator((allocator<int> *)&m_6.field_0x47);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_4e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_6.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_6.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&i,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
  local_e71 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&i);
    local_e71 = sVar4 == sVar5;
  }
  local_541 = local_e71;
  test(&local_541);
  for (local_548 = 0; local_548 < 0x18; local_548 = local_548 + 1) {
    piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                        ((View<int,true,std::allocator<unsigned_long>> *)local_4e0,local_548);
    iVar3 = *piVar10;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&i,local_548);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
    test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&i);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_498);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_568,1,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_568,0);
  *pvVar7 = 6;
  puVar1 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_588,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_588,0);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_568);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_568);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_588);
  m_7._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_7.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_5d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,(CoordinateOrder *)&m_7.field_0x44,
             (allocator_type *)&m_7.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_7.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_3,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_5d0);
  local_63c = 0;
  for (local_640 = 0; local_640 < 6; local_640 = local_640 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_3,local_640);
    shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == this->data_[local_63c];
    test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_63c = local_63c + 4;
  }
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5d0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_3);
  local_ef1 = false;
  if (sVar4 == sVar5) {
    piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                        ((View<int,true,std::allocator<unsigned_long>> *)local_5d0,0);
    iVar3 = *piVar10;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_3,0);
    local_ef1 = false;
    if (iVar3 == *piVar6) {
      sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5d0);
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_3);
      local_ef1 = sVar4 == sVar5;
    }
  }
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_ef1;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_588);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_568);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_660,1,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_660,0);
  *pvVar7 = 6;
  puVar1 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680,0);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_660);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_660);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680);
  m_8._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_8.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_6c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_ + 2,(CoordinateOrder *)&m_8.field_0x44,
             (allocator_type *)&m_8.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_8.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_4,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
  local_734 = 2;
  for (local_738 = 0; local_738 < 6; local_738 = local_738 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_4,local_738);
    shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == this->data_[local_734];
    test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_734 = local_734 + 4;
  }
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_4);
  local_f61 = false;
  if (sVar4 == sVar5) {
    piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                        ((View<int,true,std::allocator<unsigned_long>> *)local_6c8,0);
    iVar3 = *piVar10;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_4,0);
    local_f61 = false;
    if (iVar3 == *piVar6) {
      sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_4);
      local_f61 = sVar4 == sVar5;
    }
  }
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_f61;
  test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_6c8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_660);
  puVar1 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758);
  std::allocator<int>::allocator((allocator<int> *)&m_9.field_0x47);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_7a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_9.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_9.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_5,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_7a0);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_7a0);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_5);
  local_fa9 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_7a0);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_5);
    local_fa9 = sVar4 == sVar5;
  }
  y_2._3_1_ = local_fa9;
  test((bool *)((long)&y_2 + 3));
  for (local_808 = 0; local_808 < 6; local_808 = local_808 + 1) {
    for (shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_7a0,(long)local_808
                           ,shape_7.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      iVar3 = *piVar10;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_5,(long)local_808,
                          shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_5);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_7a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_758);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828,2,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828,1);
  *pvVar7 = 2;
  puVar1 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_848,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_848,0);
  *pvVar7 = 1;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_848,1);
  *pvVar7 = 3;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_848);
  m_10._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_10.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_890,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data_,(CoordinateOrder *)&m_10.field_0x44,
             (allocator_type *)&m_10.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_10.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_6,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_890);
  for (local_8fc = 0; local_8fc < 2; local_8fc = local_8fc + 1) {
    for (local_900 = 0; local_900 < 3; local_900 = local_900 + 1) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_890,(long)local_900
                           ,local_8fc);
      iVar3 = *piVar10;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_6,(long)local_900,
                          local_8fc);
      shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_890);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_6);
  local_1041 = false;
  if (sVar4 == sVar5) {
    piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                        ((View<int,true,std::allocator<unsigned_long>> *)local_890,0);
    iVar3 = *piVar10;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_6,0);
    local_1041 = false;
    if (iVar3 == *piVar6) {
      sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_890);
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_6);
      local_1041 = sVar4 == sVar5;
    }
  }
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_1041;
  test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_6);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_890);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_848);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_828);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920,2,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920,1);
  *pvVar7 = 2;
  puVar1 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_940,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_940,0);
  *pvVar7 = 1;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_940,1);
  *pvVar7 = 3;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_940);
  m_11._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_11.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_988,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data100_ + 0x32,(CoordinateOrder *)&m_11.field_0x44,
             (allocator_type *)&m_11.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_11.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_7,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  for (local_9f4 = 0; local_9f4 < 2; local_9f4 = local_9f4 + 1) {
    for (local_9f8 = 0; local_9f8 < 3; local_9f8 = local_9f8 + 1) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_988,(long)local_9f8
                           ,local_9f4);
      iVar3 = *piVar10;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&x_7,(long)local_9f8,
                          local_9f4);
      shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
      test((bool *)((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_7);
  local_10c9 = false;
  if (sVar4 == sVar5) {
    piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                        ((View<int,true,std::allocator<unsigned_long>> *)local_988,0);
    iVar3 = *piVar10;
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&x_7,0);
    local_10c9 = false;
    if (iVar3 == *piVar6) {
      sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_988);
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_7);
      local_10c9 = sVar4 == sVar5;
    }
  }
  shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_10c9;
  test((bool *)((long)&shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_7);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_988);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_940);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_920);
  puVar1 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18);
  std::allocator<int>::allocator((allocator<int> *)&m_12.field_0x47);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_a60,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&m_12.field_0x47);
  std::allocator<int>::~allocator((allocator<int> *)&m_12.field_0x47);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&x_8,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_a60);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a60);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_8);
  local_1111 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a60);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&x_8);
    local_1111 = sVar4 == sVar5;
  }
  y_5._3_1_ = local_1111;
  test((bool *)((long)&y_5 + 3));
  for (z_1 = 0; z_1 < 3; z_1 = z_1 + 1) {
    for (local_acc = 0; local_acc < 4; local_acc = local_acc + 1) {
      for (local_ad0 = 0; local_ad0 < 2; local_ad0 = local_ad0 + 1) {
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_a60,(long)z_1,
                             local_acc,local_ad0);
        iVar3 = *piVar10;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&x_8,(long)z_1,
                            local_acc,local_ad0);
        shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
        test((bool *)((long)&shape_10.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&x_8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_a60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a18);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0,3,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0,2);
  *pvVar7 = 2;
  puVar1 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,0);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,1);
  *pvVar7 = 10;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10,2);
  *pvVar7 = 0x23;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10);
  m_13._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_13.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_b58,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data100_,(CoordinateOrder *)&m_13.field_0x44,
             (allocator_type *)&m_13.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_13.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&z_2,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_b58);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b58);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&z_2);
  local_1181 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b58);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&z_2);
    local_1181 = sVar4 == sVar5;
  }
  y_6._3_1_ = local_1181;
  test((bool *)((long)&y_6 + 3));
  for (x_9 = 0; x_9 < 2; x_9 = x_9 + 1) {
    for (local_bcc = 0; local_bcc < 4; local_bcc = local_bcc + 1) {
      for (local_bd0 = 0; local_bd0 < 3; local_bd0 = local_bd0 + 1) {
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_b58,
                             (long)local_bd0,local_bcc,x_9);
        iVar3 = *piVar10;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&z_2,(long)local_bd0,
                            local_bcc,x_9);
        shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = iVar3 == *piVar6;
        test((bool *)((long)&shape_11.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&z_2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af0);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0,3,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0,2);
  *pvVar7 = 2;
  puVar1 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,0);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,1);
  *pvVar7 = 10;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10,2);
  *pvVar7 = 0x23;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0);
  iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10);
  m_14._68_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)&m_14.field_0x43);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_c58,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar11._M_current,this->data100_ + 0x1e,(CoordinateOrder *)&m_14.field_0x44,
             (allocator_type *)&m_14.field_0x43);
  std::allocator<int>::~allocator((allocator<int> *)&m_14.field_0x43);
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,true,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&z_3,
             (View<int,_true,_std::allocator<unsigned_long>_> *)local_c58);
  sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c58);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)&z_3);
  local_11f1 = false;
  if (sVar4 == sVar5) {
    sVar4 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c58);
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)&z_3);
    local_11f1 = sVar4 == sVar5;
  }
  y_7._3_1_ = local_11f1;
  test((bool *)((long)&y_7 + 3));
  for (x_10 = 0; x_10 < 2; x_10 = x_10 + 1) {
    for (local_ccc = 0; local_ccc < 4; local_ccc = local_ccc + 1) {
      for (local_cd0 = 0; local_cd0 < 3; local_cd0 = local_cd0 + 1) {
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_c58,
                             (long)local_cd0,local_ccc,x_10);
        iVar3 = *piVar10;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&z_3,(long)local_cd0,
                            local_ccc,x_10);
        local_cd1 = iVar3 == *piVar6;
        test(&local_cd1);
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)&z_3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bf0);
  return;
}

Assistant:

void MarrayTest::copyConstructorTest() {
    // contruction from a Marray
    {
        // empty 
        {
            andres::Marray<int> m;
            andres::Marray<int> n(m);
        }
        // scalar
        {
            andres::Marray<int> m(scalar_);
            andres::Marray<int> n(m);

            test(m.dimension() == n.dimension());
            test(m.size() == n.size());
            test(m(0) == n(0));
        }
        // 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 24; ++x)
                test(m(x)==n(x));
        }
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 6; ++x){
                for(int y = 0; y < 4; ++y)
                    test(m(x, y)==n(x, y));
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
            andres::Marray<int> n(m);

            test(m.size()==n.size() && m.dimension()==n.dimension()
            );
            for(int x = 0; x < 3; ++x){
                for(int y = 0; y < 4; ++y){
                    for(int z = 0; z < 2; ++z)
                        test(m(x, y, z)==n(x, y, z));
                }
            }
        }
    }
    // contruction from a view
    {
        // scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            andres::Marray<int> m(v);
            test(v.size()==m.size() &&
                   v.dimension()==m.dimension() &&
                   v(0)==m(0));
        }
        // View is 1D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 24;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);
                
                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int i = 0; i < 24; ++i)
                    test(v(i)==m(i));
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 0; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(1);
                shape[0] = 6;
                std::vector<std::size_t> strides(1);
                strides[0] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(),
                    strides.begin(), data_+2, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                int i = 2; 
                for(int x = 0; x < 6; ++x){
                    test(m(x) == data_[i]);
                    i+=4;
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 2D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 6; 
                shape[1] = 4;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 6; ++x){
                    for(int y = 0; y < 4; ++y)
                        test(v(x, y)==m(x, y));
                }
            }
            // with strides and without offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(), data_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
            // with strides and offset
            {
                std::vector<std::size_t> shape(2);
                shape[0] = 3;
                shape[1] = 2;
                std::vector<std::size_t> strides(2);
                strides[0] = 1;
                strides[1] = 3;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+50, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y)==m(x, y));
                    }
                }
                test(v.dimension() == m.dimension() &&
                       v(0) == m(0) &&
                       v.size() == m.size());
            }
        }
        // View is 3D...
        {
            // without strides
            {
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4; 
                shape[2] = 2; 
                andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int x = 0; x < 3; ++x)
                for(int y = 0; y < 4; ++y)
                for(int z = 0; z < 2; ++z){
                    test(v(x, y, z)==m(x, y, z));
                    
                }
            }
            // with strides and without offset
            {        
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
            // with strides and offset
            {       
                std::vector<std::size_t> shape(3);
                shape[0] = 3;
                shape[1] = 4;
                shape[2] = 2;
                std::vector<std::size_t> strides(3);
                strides[0] = 2;
                strides[1] = 10;
                strides[2] = 35;
                andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
                    data100_+30, andres::LastMajorOrder);
                andres::Marray<int> m(v);

                test(v.size()==m.size() && v.dimension()==m.dimension()
                );
                for(int z = 0; z < 2; ++z)
                for(int y = 0; y < 4; ++y)
                for(int x = 0; x < 3; ++x){
                    test(v(x, y, z)==m(x, y, z));
                }
            }
        }
    }
}